

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_prov.c
# Opt level: O0

int hmac_final(void *vmacctx,uchar *out,size_t *outl,size_t outsize)

{
  int iVar1;
  ulong *in_RDX;
  uchar *in_RSI;
  long in_RDI;
  hmac_data_st *macctx;
  uint hlen;
  uint local_2c [3];
  ulong *local_20;
  uchar *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else if (*(long *)(in_RDI + 0x38) == 0) {
    iVar1 = HMAC_Final(*(HMAC_CTX **)(in_RDI + 8),local_18,local_2c);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      *local_20 = (ulong)local_2c[0];
      local_4 = 1;
    }
  }
  else if (*(long *)(in_RDI + 0x98) == 0) {
    local_4 = 0;
  }
  else {
    if (local_20 != (ulong *)0x0) {
      *local_20 = *(ulong *)(in_RDI + 0x98);
    }
    memcpy(local_18,(void *)(in_RDI + 0x54),*(size_t *)(in_RDI + 0x98));
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int hmac_final(void *vmacctx, unsigned char *out, size_t *outl,
                      size_t outsize)
{
    unsigned int hlen;
    struct hmac_data_st *macctx = vmacctx;

    if (!ossl_prov_is_running())
        return 0;
    if (macctx->tls_data_size > 0) {
        if (macctx->tls_mac_out_size == 0)
            return 0;
        if (outl != NULL)
            *outl = macctx->tls_mac_out_size;
        memcpy(out, macctx->tls_mac_out, macctx->tls_mac_out_size);
        return 1;
    }
    if (!HMAC_Final(macctx->ctx, out, &hlen))
        return 0;
    *outl = hlen;
    return 1;
}